

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

BCPos bcemit_INS(FuncState *fs,BCIns ins)

{
  uint vtarget;
  LexState *pLVar1;
  BCInsLine *local_30;
  
  vtarget = fs->pc;
  pLVar1 = fs->ls;
  jmp_patchval(fs,fs->jpc,vtarget,0xff,vtarget);
  fs->jpc = 0xffffffff;
  if (vtarget < fs->bclim) {
    local_30 = fs->bcbase;
  }
  else {
    bcemit_INS_cold_1();
  }
  local_30[vtarget].ins = ins;
  local_30[vtarget].line = pLVar1->lastline;
  fs->pc = vtarget + 1;
  return vtarget;
}

Assistant:

static BCPos bcemit_INS(FuncState *fs, BCIns ins)
{
  BCPos pc = fs->pc;
  LexState *ls = fs->ls;
  jmp_patchval(fs, fs->jpc, pc, NO_REG, pc);
  fs->jpc = NO_JMP;
  if (LJ_UNLIKELY(pc >= fs->bclim)) {
    ptrdiff_t base = fs->bcbase - ls->bcstack;
    checklimit(fs, ls->sizebcstack, LJ_MAX_BCINS, "bytecode instructions");
    lj_mem_growvec(fs->L, ls->bcstack, ls->sizebcstack, LJ_MAX_BCINS,BCInsLine);
    fs->bclim = (BCPos)(ls->sizebcstack - base);
    fs->bcbase = ls->bcstack + base;
  }
  fs->bcbase[pc].ins = ins;
  fs->bcbase[pc].line = ls->lastline;
  fs->pc = pc+1;
  return pc;
}